

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_test.cc
# Opt level: O2

void TestCipher(EVP_CIPHER *cipher,Operation input_op,bool padding,Span<const_unsigned_char> key,
               Span<const_unsigned_char> iv,Span<const_unsigned_char> plaintext,
               Span<const_unsigned_char> ciphertext,Span<const_unsigned_char> aad,
               Span<const_unsigned_char> tag)

{
  Operation op;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Span<const_unsigned_char> *pSVar3;
  bool bVar4;
  Span<const_unsigned_char> SVar5;
  pointer pOVar6;
  uint uVar7;
  int iVar8;
  pointer pOVar9;
  Span<const_unsigned_char> *pSVar10;
  Span<const_unsigned_char> *pSVar11;
  undefined4 extraout_var;
  long lVar12;
  uchar *userKey;
  long lVar13;
  uint uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  char *pcVar17;
  undefined8 uVar18;
  uint32_t *this;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  long lVar19;
  ulong uVar20;
  char *pcVar21;
  bool in_place;
  ScopedTrace gtest_trace_403;
  ScopedTrace gtest_trace_397;
  ScopedTrace gtest_trace_392;
  ScopedTrace gtest_trace_405;
  size_t sStack_2a0;
  undefined1 local_298 [8];
  size_t local_290;
  AssertionResult gtest_ar_5;
  uint8_t ecount_buf [16];
  uint8_t ivec [16];
  bool copy;
  undefined7 uStack_257;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Stack_250;
  pointer local_248;
  Bytes local_240;
  ulong local_230;
  undefined2 local_222;
  size_t chunk_size;
  uint local_214;
  int local_210;
  uint num;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_208;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_200;
  int num_1;
  size_t local_1f0;
  undefined4 local_1e4;
  undefined4 local_1e0;
  Operation local_1dc;
  undefined8 local_1d8;
  size_t local_1d0;
  vector<Operation,_std::allocator<Operation>_> ops;
  Span<const_unsigned_char> local_168;
  Span<const_unsigned_char> local_158;
  uchar *local_148;
  size_t sStack_140;
  uchar *local_138;
  size_t sStack_130;
  AES_KEY aes;
  
  userKey = key.data_;
  uVar7 = EVP_CIPHER_block_size((EVP_CIPHER *)cipher);
  ops.super__Vector_base<Operation,_std::allocator<Operation>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ops.super__Vector_base<Operation,_std::allocator<Operation>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ops.super__Vector_base<Operation,_std::allocator<Operation>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (input_op == kBoth) {
    aes.rd_key[0] = 1;
    aes.rd_key[1] = 2;
    std::vector<Operation,std::allocator<Operation>>::_M_assign_aux<Operation_const*>
              ((vector<Operation,std::allocator<Operation>> *)&ops,&aes);
  }
  else {
    aes.rd_key[0] = input_op;
    std::vector<Operation,std::allocator<Operation>>::_M_assign_aux<Operation_const*>
              ((vector<Operation,std::allocator<Operation>> *)&ops,&aes);
  }
  pOVar6 = ops.super__Vector_base<Operation,_std::allocator<Operation>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_210 = (int)key.size_ * 8;
  pOVar9 = ops.super__Vector_base<Operation,_std::allocator<Operation>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if (pOVar9 == pOVar6) {
      std::_Vector_base<Operation,_std::allocator<Operation>_>::~_Vector_base
                (&ops.super__Vector_base<Operation,_std::allocator<Operation>_>);
      return;
    }
    op = *pOVar9;
    pcVar21 = (char *)(ulong)op;
    if ((char *)0x3 < pcVar21) {
      abort();
    }
    testing::ScopedTrace::ScopedTrace
              (&gtest_trace_392,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x188,&DAT_0049dd50 + *(int *)(&DAT_0049dd50 + (long)pcVar21 * 4));
    local_214 = (uint)(op == kEncrypt);
    pSVar10 = &local_168;
    pSVar3 = &local_158;
    if (op == kEncrypt) {
      pSVar10 = &local_158;
      pSVar3 = &local_168;
    }
    for (lVar13 = 0; lVar13 != 0x88; lVar13 = lVar13 + 8) {
      chunk_size = *(size_t *)((long)TestCipher::kChunkSizes + lVar13);
      testing::ScopedTrace::ScopedTrace<unsigned_long>
                (&gtest_trace_397,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x18d,&chunk_size);
      if (((chunk_size <= plaintext.size_) || (chunk_size <= ciphertext.size_)) ||
         (chunk_size <= aad.size_)) {
        local_222 = 0x100;
        for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
          in_place = *(bool *)((long)&local_222 + lVar12);
          pcVar17 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
          ;
          testing::ScopedTrace::ScopedTrace<bool>
                    (&gtest_trace_403,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                     ,0x193,&in_place);
          aes.rd_key[0]._0_2_ = 0x100;
          for (lVar19 = 0; bVar4 = in_place, lVar19 != 2; lVar19 = lVar19 + 1) {
            copy = (bool)*(undefined1 *)((long)aes.rd_key + lVar19);
            testing::ScopedTrace::ScopedTrace<bool>
                      (&gtest_trace_405,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                       ,0x195,&copy);
            pcVar17 = pcVar21;
            local_138 = userKey;
            sStack_130 = key.size_;
            TestCipherAPI(cipher,op,padding,copy,in_place,false,chunk_size,key,iv,plaintext,
                          ciphertext,aad,tag);
            if ((!padding) && (pcVar17 = (char *)chunk_size, chunk_size % (ulong)uVar7 == 0)) {
              pcVar17 = pcVar21;
              local_148 = userKey;
              sStack_140 = key.size_;
              TestCipherAPI(cipher,op,false,copy,in_place,true,chunk_size,key,iv,plaintext,
                            ciphertext,aad,tag);
            }
            testing::ScopedTrace::~ScopedTrace(&gtest_trace_405);
          }
          if (!padding) {
            local_230 = chunk_size;
            local_1d0 = iv.size_;
            local_168.data_ = plaintext.data_;
            local_168.size_ = plaintext.size_;
            local_158.data_ = ciphertext.data_;
            local_158.size_ = ciphertext.size_;
            local_1dc = op;
            _gtest_trace_405 = *pSVar3;
            pSVar11 = &local_168;
            if (op == kEncrypt) {
              pSVar11 = &local_158;
            }
            local_200 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        pSVar11->data_;
            local_208._M_head_impl =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pSVar10->size_
            ;
            iVar8 = EVP_CIPHER_nid((EVP_CIPHER *)cipher);
            uVar14 = iVar8 - 0x1a4;
            if ((uVar14 < 9) &&
               (uVar18 = CONCAT71((int7)((ulong)pcVar17 >> 8),1),
               (0x111U >> (uVar14 & 0x1f) & 1) != 0)) {
LAB_00219309:
              uVar16 = (undefined4)uVar18;
              if ((8 < iVar8 - 0x1a3U) || ((0x111U >> (iVar8 - 0x1a3U & 0x1f) & 1) == 0)) {
                if ((char)uVar18 == '\0') goto LAB_002198f6;
                uVar16 = (undefined4)CONCAT71((int7)((ulong)uVar18 >> 8),1);
              }
              uVar15 = 0;
            }
            else {
              uVar15 = (undefined4)CONCAT71((uint7)(uint3)(uVar14 >> 8),1);
              uVar18 = 0;
              uVar16 = 0;
              if (2 < iVar8 - 0x388U) goto LAB_00219309;
            }
            _copy = 3;
            local_1e4 = uVar16;
            local_1e0 = uVar15;
            local_1d8 = CONCAT44(extraout_var,iVar8);
            testing::internal::CmpHelperNE<Operation,Operation>
                      ((internal *)&aes,"op","Operation::kInvalidDecrypt",&local_1dc,
                       (Operation *)&copy);
            if ((char)aes.rd_key[0] == '\0') {
              testing::Message::Message((Message *)&copy);
              pcVar17 = "";
              if (aes.rd_key._8_8_ != 0) {
                pcVar17 = *(char **)aes.rd_key._8_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_298,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                         ,0x134,pcVar17);
              testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)&copy)
              ;
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
              if (_copy != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                            *)0x0) {
                (**(code **)(*(long *)_copy + 8))();
              }
              this = aes.rd_key + 2;
            }
            else {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(aes.rd_key + 2));
              if (((op == kEncrypt) || (uVar14 = (int)local_1d8 - 0x1a3, 8 < uVar14)) ||
                 ((0x111U >> (uVar14 & 0x1f) & 1) == 0)) {
                auVar1._12_4_ = 0;
                auVar1._0_12_ = stack0xfffffffffffffd6c;
                _local_298 = (Span<unsigned_char>)(auVar1 << 0x20);
                ivec._0_4_ = AES_set_encrypt_key(userKey,local_210,(AES_KEY *)&aes);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&copy,"0",
                           "AES_set_encrypt_key(key.data(), key.size() * 8, &aes)",(int *)local_298,
                           (int *)ivec);
                if (copy != false) goto LAB_00219566;
                testing::Message::Message((Message *)local_298);
                pcVar17 = "";
                if (_Stack_250._M_head_impl !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar17 = ((_Stack_250._M_head_impl)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)ivec,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                           ,0x138,pcVar17);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)ivec,(Message *)local_298);
              }
              else {
                auVar2._12_4_ = 0;
                auVar2._0_12_ = stack0xfffffffffffffd6c;
                _local_298 = (Span<unsigned_char>)(auVar2 << 0x20);
                ivec._0_4_ = AES_set_decrypt_key(userKey,local_210,(AES_KEY *)&aes);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&copy,"0",
                           "AES_set_decrypt_key(key.data(), key.size() * 8, &aes)",(int *)local_298,
                           (int *)ivec);
                if (copy != false) {
LAB_00219566:
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&_Stack_250);
                  _copy = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0;
                  _Stack_250._M_head_impl =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                  local_248 = (pointer)0x0;
                  if (bVar4 == false) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&copy,
                               (size_type)local_208._M_head_impl);
                  }
                  else {
                    std::vector<unsigned_char,std::allocator<unsigned_char>>::
                    _M_assign_aux<unsigned_char_const*>
                              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&copy,
                               _gtest_trace_405,_gtest_trace_405 + sStack_2a0);
                  }
                  SVar5 = _gtest_trace_405;
                  gtest_ar_5._0_8_ = (long)_Stack_250._M_head_impl - (long)_copy;
                  local_290 = gtest_ar_5._0_8_;
                  local_298 = (undefined1  [8])_copy;
                  ecount_buf[0] = (undefined1)sStack_2a0;
                  ecount_buf[1] = sStack_2a0._1_1_;
                  ecount_buf[2] = sStack_2a0._2_1_;
                  ecount_buf[3] = sStack_2a0._3_1_;
                  ecount_buf[4] = sStack_2a0._4_1_;
                  ecount_buf[5] = sStack_2a0._5_1_;
                  ecount_buf[6] = sStack_2a0._6_1_;
                  ecount_buf[7] = sStack_2a0._7_1_;
                  _gtest_trace_405 = SVar5;
                  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                            ((internal *)ivec,"in.size()","out.size()",(unsigned_long *)ecount_buf,
                             (unsigned_long *)&gtest_ar_5);
                  if (ivec[0] == '\0') {
                    testing::Message::Message((Message *)ecount_buf);
                    pcVar17 = "";
                    if (ivec._8_8_ != 0) {
                      pcVar17 = *(char **)ivec._8_8_;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_5,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                               ,0x145,pcVar17);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_5,(Message *)ecount_buf);
LAB_002198c1:
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
                    if (ecount_buf._0_8_ != 0) {
                      (**(code **)(*(long *)ecount_buf._0_8_ + 8))();
                    }
                    this_00 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(ivec + 8);
LAB_002198e4:
                    std::
                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~unique_ptr(this_00);
                  }
                  else {
                    std::
                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)(ivec + 8));
                    ecount_buf[0] = (undefined1)local_1d0;
                    ecount_buf[1] = local_1d0._1_1_;
                    ecount_buf[2] = local_1d0._2_1_;
                    ecount_buf[3] = local_1d0._3_1_;
                    ecount_buf[4] = local_1d0._4_1_;
                    ecount_buf[5] = local_1d0._5_1_;
                    ecount_buf[6] = local_1d0._6_1_;
                    ecount_buf[7] = local_1d0._7_1_;
                    gtest_ar_5.success_ = true;
                    gtest_ar_5._1_7_ = 0;
                    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                              ((internal *)ivec,"iv.size()","size_t{16}",(unsigned_long *)ecount_buf
                               ,(unsigned_long *)&gtest_ar_5);
                    if (ivec[0] == '\0') {
                      testing::Message::Message((Message *)ecount_buf);
                      pcVar17 = "";
                      if (ivec._8_8_ != 0) {
                        pcVar17 = *(char **)ivec._8_8_;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_5,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                                 ,0x148,pcVar17);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_5,(Message *)ecount_buf);
                      goto LAB_002198c1;
                    }
                    std::
                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)(ivec + 8));
                    if (local_1d0 != 0) {
                      memcpy((internal *)ivec,iv.data_,local_1d0);
                    }
                    if ((char)local_1e0 != '\0') {
                      num = 0;
                      if (local_230 == 0) {
                        AES_ctr128_encrypt(_gtest_trace_405,(uchar *)local_298,sStack_2a0,
                                           (AES_KEY *)&aes,(uchar *)ivec,ecount_buf,&num);
                      }
                      else {
                        do {
                          uVar20 = sStack_2a0;
                          if (local_230 <= sStack_2a0) {
                            uVar20 = local_230;
                          }
                          AES_ctr128_encrypt(_gtest_trace_405,(uchar *)local_298,uVar20,
                                             (AES_KEY *)&aes,ivec,ecount_buf,&num);
                          _gtest_trace_405 =
                               bssl::Span<const_unsigned_char>::subspan
                                         ((Span<const_unsigned_char> *)&gtest_trace_405,uVar20,
                                          0xffffffffffffffff);
                          _local_298 = bssl::Span<unsigned_char>::subspan
                                                 ((Span<unsigned_char> *)local_298,uVar20,
                                                  0xffffffffffffffff);
                        } while (sStack_2a0 != 0);
                      }
                      local_240.span_.data_ = (uchar *)local_200;
                      local_240.span_.size_ = (size_t)local_208._M_head_impl;
                      local_1f0 = (long)_Stack_250._M_head_impl - (long)_copy;
                      _num_1 = (AssertHelperData *)_copy;
                      testing::internal::CmpHelperEQ<Bytes,Bytes>
                                ((internal *)&gtest_ar_5,"Bytes(expected)","Bytes(result)",
                                 &local_240,(Bytes *)&num_1);
                      if (gtest_ar_5.success_ == false) {
                        testing::Message::Message((Message *)&local_240);
                        pcVar17 = "";
                        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )gtest_ar_5.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl !=
                            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )0x0) {
                          pcVar17 = *(char **)gtest_ar_5.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&num_1,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                                   ,0x15b,pcVar17);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&num_1,(Message *)&local_240);
                        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&num_1);
                        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                             *)local_240.span_.data_ !=
                            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                             *)0x0) {
                          (**(code **)(*(long *)local_240.span_.data_ + 8))();
                        }
                      }
                      this_00 = &gtest_ar_5.message_;
                      goto LAB_002198e4;
                    }
                    uVar14 = (int)local_1d8 - 0x1a3;
                    if (((uVar14 < 9) && ((0x111U >> (uVar14 & 0x1f) & 1) != 0)) &&
                       ((local_230 & 0xf) == 0)) {
                      if (local_230 == 0) {
                        AES_cbc_encrypt(_gtest_trace_405,(uchar *)local_298,sStack_2a0,
                                        (AES_KEY *)&aes,(uchar *)ivec,local_214);
                      }
                      else {
                        do {
                          uVar20 = sStack_2a0;
                          if (local_230 <= sStack_2a0) {
                            uVar20 = local_230;
                          }
                          AES_cbc_encrypt(_gtest_trace_405,(uchar *)local_298,uVar20,(AES_KEY *)&aes
                                          ,ivec,local_214);
                          _gtest_trace_405 =
                               bssl::Span<const_unsigned_char>::subspan
                                         ((Span<const_unsigned_char> *)&gtest_trace_405,uVar20,
                                          0xffffffffffffffff);
                          _local_298 = bssl::Span<unsigned_char>::subspan
                                                 ((Span<unsigned_char> *)local_298,uVar20,
                                                  0xffffffffffffffff);
                        } while (sStack_2a0 != 0);
                      }
                      gtest_ar_5._0_8_ = local_200;
                      gtest_ar_5.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl =
                           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                            )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                              )local_208._M_head_impl;
                      local_240.span_.size_ = (long)_Stack_250._M_head_impl - (long)_copy;
                      local_240.span_.data_ = (uchar *)_copy;
                      testing::internal::CmpHelperEQ<Bytes,Bytes>
                                ((internal *)ecount_buf,"Bytes(expected)","Bytes(result)",
                                 (Bytes *)&gtest_ar_5,&local_240);
                      if (ecount_buf[0] == '\0') {
                        testing::Message::Message((Message *)&gtest_ar_5);
                        pcVar17 = "";
                        if (ecount_buf._8_8_ != 0) {
                          pcVar17 = *(char **)ecount_buf._8_8_;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&local_240,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                                   ,0x168,pcVar17);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&local_240,(Message *)&gtest_ar_5);
LAB_00219da0:
                        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_240);
                        if (gtest_ar_5._0_8_ != 0) {
                          (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
                        }
                      }
LAB_00219dbb:
                      this_00 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)(ecount_buf + 8);
                      goto LAB_002198e4;
                    }
                    if ((char)local_1e4 != '\0') {
                      _num_1 = _num_1 & 0xffffffff00000000;
                      if (local_230 == 0) {
                        AES_ofb128_encrypt(_gtest_trace_405,(uchar *)local_298,sStack_2a0,
                                           (AES_KEY *)&aes,ivec,&num_1);
                      }
                      else {
                        do {
                          uVar20 = sStack_2a0;
                          if (local_230 <= sStack_2a0) {
                            uVar20 = local_230;
                          }
                          AES_ofb128_encrypt(_gtest_trace_405,(uchar *)local_298,uVar20,
                                             (AES_KEY *)&aes,ivec,&num_1);
                          _gtest_trace_405 =
                               bssl::Span<const_unsigned_char>::subspan
                                         ((Span<const_unsigned_char> *)&gtest_trace_405,uVar20,
                                          0xffffffffffffffff);
                          _local_298 = bssl::Span<unsigned_char>::subspan
                                                 ((Span<unsigned_char> *)local_298,uVar20,
                                                  0xffffffffffffffff);
                        } while (sStack_2a0 != 0);
                      }
                      gtest_ar_5._0_8_ = local_200;
                      gtest_ar_5.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl =
                           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                            )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                              )local_208._M_head_impl;
                      local_240.span_.size_ = (long)_Stack_250._M_head_impl - (long)_copy;
                      local_240.span_.data_ = (uchar *)_copy;
                      testing::internal::CmpHelperEQ<Bytes,Bytes>
                                ((internal *)ecount_buf,"Bytes(expected)","Bytes(result)",
                                 (Bytes *)&gtest_ar_5,&local_240);
                      if (ecount_buf[0] == '\0') {
                        testing::Message::Message((Message *)&gtest_ar_5);
                        pcVar17 = "";
                        if (ecount_buf._8_8_ != 0) {
                          pcVar17 = *(char **)ecount_buf._8_8_;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&local_240,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                                   ,0x175,pcVar17);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&local_240,(Message *)&gtest_ar_5);
                        goto LAB_00219da0;
                      }
                      goto LAB_00219dbb;
                    }
                  }
                  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&copy);
                  goto LAB_002198f6;
                }
                testing::Message::Message((Message *)local_298);
                pcVar17 = "";
                if (_Stack_250._M_head_impl !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar17 = ((_Stack_250._M_head_impl)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)ivec,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                           ,0x13a,pcVar17);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)ivec,(Message *)local_298);
              }
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)ivec);
              if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                   )local_298 !=
                  (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                (**(code **)(*(long *)local_298 + 8))();
              }
              this = (uint32_t *)&_Stack_250;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)this);
          }
LAB_002198f6:
          testing::ScopedTrace::~ScopedTrace(&gtest_trace_403);
        }
      }
      testing::ScopedTrace::~ScopedTrace(&gtest_trace_397);
    }
    testing::ScopedTrace::~ScopedTrace(&gtest_trace_392);
    pOVar9 = pOVar9 + 1;
  } while( true );
}

Assistant:

static void TestCipher(const EVP_CIPHER *cipher, Operation input_op,
                       bool padding, bssl::Span<const uint8_t> key,
                       bssl::Span<const uint8_t> iv,
                       bssl::Span<const uint8_t> plaintext,
                       bssl::Span<const uint8_t> ciphertext,
                       bssl::Span<const uint8_t> aad,
                       bssl::Span<const uint8_t> tag) {
  size_t block_size = EVP_CIPHER_block_size(cipher);
  std::vector<Operation> ops;
  if (input_op == Operation::kBoth) {
    ops = {Operation::kEncrypt, Operation::kDecrypt};
  } else {
    ops = {input_op};
  }
  for (Operation op : ops) {
    SCOPED_TRACE(OperationToString(op));
    // Zero indicates a single-shot API.
    static const size_t kChunkSizes[] = {0,  1,  2,  5,  7,  8,  9,  15, 16,
                                         17, 31, 32, 33, 63, 64, 65, 512};
    for (size_t chunk_size : kChunkSizes) {
      SCOPED_TRACE(chunk_size);
      if (chunk_size > plaintext.size() && chunk_size > ciphertext.size() &&
          chunk_size > aad.size()) {
        continue;
      }
      for (bool in_place : {false, true}) {
        SCOPED_TRACE(in_place);
        for (bool copy : {false, true}) {
          SCOPED_TRACE(copy);
          TestCipherAPI(cipher, op, padding, copy, in_place,
                        /*use_evp_cipher=*/false, chunk_size, key, iv,
                        plaintext, ciphertext, aad, tag);
          if (!padding && chunk_size % block_size == 0) {
            TestCipherAPI(cipher, op, padding, copy, in_place,
                          /*use_evp_cipher=*/true, chunk_size, key, iv,
                          plaintext, ciphertext, aad, tag);
          }
        }
        if (!padding) {
          TestLowLevelAPI(cipher, op, in_place, chunk_size, key, iv, plaintext,
                          ciphertext);
        }
      }
    }
  }
}